

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurImage.cpp
# Opt level: O0

void blurImage(EnvmapImage *image1,bool verbose)

{
  Envmap EVar1;
  int iVar2;
  ostream *poVar3;
  Box2i *pBVar4;
  void *pvVar5;
  float *pfVar6;
  Rgba *pRVar7;
  Array2D<Imf_3_2::Rgba> *pAVar8;
  Rgba *__src;
  byte in_SIL;
  EnvmapImage *in_RDI;
  float fVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  size_t size;
  int h_2;
  int w_2;
  Box2i dw_3;
  Rgba *pixel1;
  double weight_2;
  V2f pos1;
  V3f dir1;
  V2f posInFace1;
  int x1;
  int y1;
  CubeMapFace face1;
  int f1;
  Rgba *pixel2;
  double aTotal;
  double bTotal;
  double gTotal;
  double rTotal;
  double weightTotal_1;
  V2f pos2;
  V3f dir2;
  V2f posInFace2;
  int x2;
  int y2;
  CubeMapFace face2;
  int f2;
  Array2D<Imf_3_2::Rgba> *pixels2;
  Array2D<Imf_3_2::Rgba> *pixels1;
  int sof2;
  Box2i dw2;
  int sof1;
  Box2i dw1;
  Rgba *end;
  Rgba *p;
  double weight;
  size_t numPixels;
  int h_1;
  int w_1;
  Rgba *pixel;
  double weight_1;
  V2f pos;
  V3f dir;
  V2f posInFace;
  bool xEdge;
  int x;
  bool yEdge;
  int y;
  int iz;
  int iy;
  int ix;
  V3f faceDir;
  CubeMapFace face;
  int f;
  double weightTotal;
  Array2D<Imf_3_2::Rgba> *pixels;
  int sof;
  Box2i dw_2;
  Box2i dw_1;
  Box2i dw;
  int h;
  int w;
  EnvmapImage *iptr2;
  EnvmapImage *iptr1;
  EnvmapImage image2;
  int OUT_WIDTH;
  int MAX_IN_WIDTH;
  undefined4 in_stack_fffffffffffffae8;
  float in_stack_fffffffffffffaec;
  Box2i *in_stack_fffffffffffffaf0;
  Vec2<int> *in_stack_fffffffffffffaf8;
  EnvmapImage *in_stack_fffffffffffffb00;
  Vec3<float> *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  undefined8 in_stack_fffffffffffffb68;
  Box2i *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  uint uVar14;
  EnvmapImage *in_stack_fffffffffffffb80;
  Vec2<float> *this;
  bool local_392;
  bool local_391;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  Vec2<float> local_29c;
  float local_294;
  float local_290;
  undefined1 local_28c [12];
  Vec2<float> local_280;
  int local_278;
  int local_274;
  uint local_270;
  uint local_26c;
  Rgba *local_268;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  double local_240;
  Vec2<float> local_234;
  float local_22c;
  float local_228;
  undefined1 local_224 [12];
  Vec2<float> local_218;
  int local_210;
  int local_20c;
  uint local_208;
  uint local_204;
  Array2D<Imf_3_2::Rgba> *local_200;
  Array2D<Imf_3_2::Rgba> *local_1f8;
  int local_1f0;
  Vec2<int> local_1ec;
  Vec2<int> local_1e4;
  Box local_1dc [16];
  int local_1cc;
  Box local_1c8 [16];
  Rgba *local_1b8;
  Rgba *local_1b0;
  double local_1a8;
  long local_1a0;
  int local_198;
  int local_194;
  Rgba *local_190;
  double local_188;
  Vec2<float> local_180;
  float local_178;
  float local_174;
  undefined1 local_170 [12];
  Vec3<float> local_164;
  Vec2<float> local_158;
  bool local_14d;
  int local_14c;
  bool local_145;
  int local_144;
  Vec3<float> local_140;
  Vec3<float> local_134;
  Vec3<float> local_128;
  Vec3<float> local_11c;
  Vec3<float> local_110;
  Vec3<float> local_104;
  int local_f8;
  int local_f4;
  int local_f0;
  Vec3<float> local_ec;
  uint local_e0;
  uint local_dc;
  double local_d8;
  Array2D<Imf_3_2::Rgba> *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  Vec2<int> local_b0;
  Vec2<int> local_a8 [3];
  Vec2<int> local_90;
  Vec2<int> local_88 [3];
  int local_70;
  int local_5c;
  EnvmapImage *local_58;
  EnvmapImage *local_50;
  EnvmapImage local_48;
  undefined4 local_14;
  undefined4 local_10;
  byte local_9;
  EnvmapImage *local_8;
  
  local_9 = in_SIL & 1;
  local_10 = 0x28;
  local_14 = 100;
  local_8 = in_RDI;
  if (local_9 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"blurring map image");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  EnvmapImage::EnvmapImage
            ((EnvmapImage *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
  local_50 = local_8;
  local_58 = &local_48;
  pBVar4 = EnvmapImage::dataWindow(local_8);
  iVar2 = (pBVar4->max).x;
  pBVar4 = EnvmapImage::dataWindow(local_8);
  local_5c = (iVar2 - (pBVar4->min).x) + 1;
  local_70 = local_5c * 6;
  EVar1 = EnvmapImage::type(local_50);
  if (EVar1 == ENVMAP_LATLONG) {
    if ((local_9 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"    converting to cube-face format");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    if (local_5c < 0) {
      local_5c = local_5c + 3;
    }
    local_5c = local_5c >> 2;
    local_70 = local_5c * 6;
    Imath_3_2::Vec2<int>::Vec2(local_88,0,0);
    Imath_3_2::Vec2<int>::Vec2(&local_90,local_5c + -1,local_70 + -1);
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
              ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
               &in_stack_fffffffffffffaf0->min);
    resizeCube(in_stack_fffffffffffffb80,
               (EnvmapImage *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
               in_stack_fffffffffffffb70,(float)((ulong)in_stack_fffffffffffffb68 >> 0x20),
               (int)in_stack_fffffffffffffb68);
    std::swap<EnvmapImage*>(&local_50,&local_58);
  }
  while (0x28 < local_5c) {
    if (local_5c < 0x50) {
      local_5c = 0x28;
    }
    else {
      local_5c = local_5c / 2;
    }
    local_70 = local_5c * 6;
    if ((local_9 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"    resizing cube faces to ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_5c);
      poVar3 = std::operator<<(poVar3," by ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_5c);
      poVar3 = std::operator<<(poVar3," pixels");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    Imath_3_2::Vec2<int>::Vec2(local_a8,0,0);
    Imath_3_2::Vec2<int>::Vec2(&local_b0,local_5c + -1,local_70 + -1);
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
              ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
               &in_stack_fffffffffffffaf0->min);
    resizeCube(in_stack_fffffffffffffb80,
               (EnvmapImage *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
               in_stack_fffffffffffffb70,(float)((ulong)in_stack_fffffffffffffb68 >> 0x20),
               (int)in_stack_fffffffffffffb68);
    std::swap<EnvmapImage*>(&local_50,&local_58);
  }
  if ((local_9 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"    computing pixel weights");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  EnvmapImage::dataWindow(local_50);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffaf0,
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  local_c4 = Imf_3_2::CubeMap::sizeOfFace((Box *)&local_c0);
  local_d0 = EnvmapImage::pixels(local_50);
  local_d8 = 0.0;
  for (local_dc = 0; (int)local_dc < 6; local_dc = local_dc + 1) {
    if ((local_9 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"        face ");
      pvVar5 = (void *)std::ostream::operator<<(poVar3,local_dc);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    local_e0 = local_dc;
    Imath_3_2::Vec3<float>::Vec3(&local_ec,0.0,0.0,0.0);
    local_f0 = 0;
    local_f4 = 0;
    local_f8 = 0;
    switch(local_e0) {
    case 0:
      Imath_3_2::Vec3<float>::Vec3(&local_104,1.0,0.0,0.0);
      Imath_3_2::Vec3<float>::operator=(&local_ec,&local_104);
      local_f0 = 0;
      local_f4 = 1;
      local_f8 = 2;
      break;
    case 1:
      Imath_3_2::Vec3<float>::Vec3(&local_110,-1.0,0.0,0.0);
      Imath_3_2::Vec3<float>::operator=(&local_ec,&local_110);
      local_f0 = 0;
      local_f4 = 1;
      local_f8 = 2;
      break;
    case 2:
      Imath_3_2::Vec3<float>::Vec3(&local_11c,0.0,1.0,0.0);
      Imath_3_2::Vec3<float>::operator=(&local_ec,&local_11c);
      local_f0 = 1;
      local_f4 = 0;
      local_f8 = 2;
      break;
    case 3:
      Imath_3_2::Vec3<float>::Vec3(&local_128,0.0,-1.0,0.0);
      Imath_3_2::Vec3<float>::operator=(&local_ec,&local_128);
      local_f0 = 1;
      local_f4 = 0;
      local_f8 = 2;
      break;
    case 4:
      Imath_3_2::Vec3<float>::Vec3(&local_134,0.0,0.0,1.0);
      Imath_3_2::Vec3<float>::operator=(&local_ec,&local_134);
      local_f0 = 2;
      local_f4 = 0;
      local_f8 = 1;
      break;
    case 5:
      Imath_3_2::Vec3<float>::Vec3(&local_140,0.0,0.0,-1.0);
      Imath_3_2::Vec3<float>::operator=(&local_ec,&local_140);
      local_f0 = 2;
      local_f4 = 0;
      local_f8 = 1;
    }
    for (local_144 = 0; local_144 < local_c4; local_144 = local_144 + 1) {
      local_391 = local_144 == 0 || local_144 == local_c4 + -1;
      local_145 = local_391;
      for (local_14c = 0; local_14c < local_c4; local_14c = local_14c + 1) {
        local_392 = local_14c == 0 || local_14c == local_c4 + -1;
        local_14d = local_392;
        Imath_3_2::Vec2<float>::Vec2(&local_158,(float)local_14c,(float)local_144);
        Imf_3_2::CubeMap::direction((CubeMapFace)local_170,(Box *)(ulong)local_e0,(Vec2 *)&local_c0)
        ;
        Imath_3_2::Vec3<float>::normalized(in_stack_fffffffffffffb08);
        uVar14 = local_e0;
        Imath_3_2::Vec2<float>::Vec2(&local_180,&local_158);
        Imf_3_2::CubeMap::pixelPosition(&local_178,uVar14,&local_c0,&local_180);
        fVar9 = Imath_3_2::Vec3<float>::operator^
                          ((Vec3<float> *)in_stack_fffffffffffffaf0,
                           (Vec3<float> *)
                           CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        pfVar6 = Imath_3_2::Vec3<float>::operator[](&local_164,local_f4);
        fVar10 = *pfVar6;
        pfVar6 = Imath_3_2::Vec3<float>::operator[](&local_164,local_f0);
        dVar11 = sqr((double)(fVar10 / *pfVar6));
        pfVar6 = Imath_3_2::Vec3<float>::operator[](&local_164,local_f8);
        fVar10 = *pfVar6;
        pfVar6 = Imath_3_2::Vec3<float>::operator[](&local_164,local_f0);
        dVar12 = sqr((double)(fVar10 / *pfVar6));
        pAVar8 = local_d0;
        local_188 = (double)fVar9 * (dVar11 + dVar12 + 1.0);
        if (((local_14d & 1U) == 0) || ((local_145 & 1U) == 0)) {
          if (((local_14d & 1U) != 0) || ((local_145 & 1U) != 0)) {
            local_188 = local_188 / 2.0;
          }
        }
        else {
          local_188 = local_188 / 3.0;
        }
        iVar2 = toInt(local_174);
        pRVar7 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](pAVar8,(long)iVar2);
        iVar2 = toInt(local_178);
        local_190 = pRVar7 + iVar2;
        Imath_3_2::half::operator*=((half *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
        Imath_3_2::half::operator*=((half *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
        Imath_3_2::half::operator*=((half *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
        Imath_3_2::half::operator*=((half *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
        local_d8 = local_188 + local_d8;
      }
    }
  }
  local_194 = (local_b8 - local_c0) + 1;
  local_198 = (local_b4 - local_bc) + 1;
  iVar2 = local_194 * local_198;
  local_1a0 = (long)iVar2;
  auVar13._8_4_ = iVar2 >> 0x1f;
  auVar13._0_8_ = local_1a0;
  auVar13._12_4_ = 0x45300000;
  local_1a8 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) / local_d8;
  local_1b0 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_d0,0);
  local_1b8 = local_1b0 + local_1a0;
  for (; local_1b0 < local_1b8; local_1b0 = local_1b0 + 1) {
    Imath_3_2::half::operator*=((half *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    Imath_3_2::half::operator*=((half *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    Imath_3_2::half::operator*=((half *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    Imath_3_2::half::operator*=((half *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
  }
  if ((local_9 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"    generating blurred image");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  EnvmapImage::dataWindow(local_50);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffaf0,
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
  local_1cc = Imf_3_2::CubeMap::sizeOfFace(local_1c8);
  Imath_3_2::Vec2<int>::Vec2(&local_1e4,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_1ec,99,599);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
             &in_stack_fffffffffffffaf0->min);
  local_1f0 = Imf_3_2::CubeMap::sizeOfFace(local_1dc);
  EnvmapImage::resize(in_stack_fffffffffffffb00,(Envmap)((ulong)in_stack_fffffffffffffaf8 >> 0x20),
                      in_stack_fffffffffffffaf0);
  EnvmapImage::clear(in_stack_fffffffffffffb00);
  local_1f8 = EnvmapImage::pixels(local_50);
  local_200 = EnvmapImage::pixels(local_58);
  for (local_204 = 0; EVar1 = (Envmap)((ulong)in_stack_fffffffffffffaf8 >> 0x20), (int)local_204 < 6
      ; local_204 = local_204 + 1) {
    if ((local_9 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"        face ");
      pvVar5 = (void *)std::ostream::operator<<(poVar3,local_204);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    local_208 = local_204;
    for (local_20c = 0; local_20c < local_1f0; local_20c = local_20c + 1) {
      for (local_210 = 0; local_210 < local_1f0; local_210 = local_210 + 1) {
        Imath_3_2::Vec2<float>::Vec2(&local_218,(float)local_210,(float)local_20c);
        Imf_3_2::CubeMap::direction
                  ((CubeMapFace)local_224,(Box *)(ulong)local_208,(Vec2 *)local_1dc);
        this = &local_234;
        uVar14 = local_208;
        Imath_3_2::Vec2<float>::Vec2(this,&local_218);
        Imf_3_2::CubeMap::pixelPosition(&local_22c,uVar14,local_1dc,this);
        local_240 = 0.0;
        local_248 = 0.0;
        local_250 = 0.0;
        local_258 = 0.0;
        local_260 = 0.0;
        pAVar8 = local_200;
        iVar2 = toInt(local_228);
        pRVar7 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](pAVar8,(long)iVar2);
        iVar2 = toInt(local_22c);
        local_268 = pRVar7 + iVar2;
        for (local_26c = 0; (int)local_26c < 6; local_26c = local_26c + 1) {
          local_270 = local_26c;
          for (local_274 = 0; local_274 < local_1cc; local_274 = local_274 + 1) {
            for (local_278 = 0; local_278 < local_1cc; local_278 = local_278 + 1) {
              Imath_3_2::Vec2<float>::Vec2(&local_280,(float)local_278,(float)local_274);
              Imf_3_2::CubeMap::direction
                        ((CubeMapFace)local_28c,(Box *)(ulong)local_270,(Vec2 *)local_1c8);
              uVar14 = local_270;
              Imath_3_2::Vec2<float>::Vec2(&local_29c,&local_280);
              Imf_3_2::CubeMap::pixelPosition(&local_294,uVar14,local_1c8,&local_29c);
              fVar10 = Imath_3_2::Vec3<float>::operator^
                                 ((Vec3<float> *)in_stack_fffffffffffffaf0,
                                  (Vec3<float> *)
                                  CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
              pAVar8 = local_1f8;
              dVar11 = (double)fVar10;
              if (0.0 < dVar11) {
                iVar2 = toInt(local_290);
                Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](pAVar8,(long)iVar2);
                toInt(local_294);
                local_240 = dVar11 + local_240;
                fVar10 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffaf0);
                local_248 = (double)fVar10 * dVar11 + local_248;
                fVar10 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffaf0);
                local_250 = (double)fVar10 * dVar11 + local_250;
                fVar10 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffaf0);
                local_258 = (double)fVar10 * dVar11 + local_258;
                fVar10 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffaf0);
                local_260 = (double)fVar10 * dVar11 + local_260;
              }
            }
          }
        }
        Imath_3_2::half::operator=((half *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
        Imath_3_2::half::operator=((half *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
        Imath_3_2::half::operator=((half *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
        Imath_3_2::half::operator=((half *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
      }
    }
  }
  std::swap<EnvmapImage*>(&local_50,&local_58);
  if (local_50 != local_8) {
    if ((local_9 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"    copying");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    EnvmapImage::dataWindow(local_50);
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
              (in_stack_fffffffffffffaf0,
               (Box<Imath_3_2::Vec2<int>_> *)
               CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    EnvmapImage::resize(in_stack_fffffffffffffb00,EVar1,in_stack_fffffffffffffaf0);
    pAVar8 = EnvmapImage::pixels(local_8);
    pRVar7 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](pAVar8,0);
    pAVar8 = EnvmapImage::pixels(local_50);
    __src = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](pAVar8,0);
    memcpy(pRVar7,__src,(long)(((local_2b8 - local_2c0) + 1) * ((local_2b4 - local_2bc) + 1)) << 3);
  }
  EnvmapImage::~EnvmapImage((EnvmapImage *)0x104e68);
  return;
}

Assistant:

void
blurImage (EnvmapImage& image1, bool verbose)
{
    //
    // Ideally we would blur the input image directly by convolving
    // it with a 180-degree wide blur kernel.  Unfortunately this
    // is prohibitively expensive when the input image is large.
    // In order to keep running times reasonable, we perform the
    // blur on a small proxy image that will later be re-sampled
    // to the desired output resolution.
    //
    // Here's how it works:
    //
    // * If the input image is in latitude-longitude format,
    //   convert it into a cube-face environment map.
    //
    // * Repeatedly resample the image, each time shrinking
    //   it to no less than half its current size, until the
    //   width of each cube face is MAX_IN_WIDTH pixels.
    //
    // * Multiply each pixel by a weight that is proportional
    //   to the solid angle subtended by the pixel as seen
    //   from the center of the environment cube.
    //
    // * Create an output image in cube-face format.
    //   The cube faces of the output image are OUT_WIDTH
    //   pixels wide.
    //
    // * For each pixel of the output image:
    //
    //       Set the output pixel's color to black
    //
    //       Determine the direction, d2, from the center of the
    //       output environment cube to the center of the output
    //	     pixel.
    //
    //       For each pixel of the input image:
    //
    //           Determine the direction, d1, from the center of
    //           the input environment cube to the center of the
    //           input pixel.
    //
    //           Multiply the input pixel's color by max (0, d1.dot(d2))
    //           and add the result to the output pixel.
    //

    const int MAX_IN_WIDTH = 40;
    const int OUT_WIDTH    = 100;

    if (verbose) cout << "blurring map image" << endl;

    EnvmapImage  image2;
    EnvmapImage* iptr1 = &image1;
    EnvmapImage* iptr2 = &image2;

    int w = image1.dataWindow ().max.x - image1.dataWindow ().min.x + 1;
    int h = w * 6;

    if (iptr1->type () == ENVMAP_LATLONG)
    {
        //
        // Convert the input image from latitude-longitude
        // to cube-face format.
        //

        if (verbose) cout << "    converting to cube-face format" << endl;

        w /= 4;
        h = w * 6;

        Box2i dw (V2i (0, 0), V2i (w - 1, h - 1));
        resizeCube (*iptr1, *iptr2, dw, 1, 7);

        swap (iptr1, iptr2);
    }

    while (w > MAX_IN_WIDTH)
    {
        //
        // Shrink the image.
        //

        if (w >= MAX_IN_WIDTH * 2)
            w /= 2;
        else
            w = MAX_IN_WIDTH;

        h = w * 6;

        if (verbose)
        {
            cout << "    resizing cube faces "
                    "to "
                 << w << " by " << w << " pixels" << endl;
        }

        Box2i dw (V2i (0, 0), V2i (w - 1, h - 1));
        resizeCube (*iptr1, *iptr2, dw, 1, 7);

        swap (iptr1, iptr2);
    }

    if (verbose) cout << "    computing pixel weights" << endl;

    {
        //
        // Multiply each pixel by a weight that is proportional
        // to the solid angle subtended by the pixel.
        //

        Box2i dw  = iptr1->dataWindow ();
        int   sof = CubeMap::sizeOfFace (dw);

        Array2D<Rgba>& pixels = iptr1->pixels ();

        double weightTotal = 0;

        for (int f = CUBEFACE_POS_X; f <= CUBEFACE_NEG_Z; ++f)
        {
            if (verbose) cout << "        face " << f << endl;

            CubeMapFace face = CubeMapFace (f);
            V3f         faceDir (0, 0, 0);
            int         ix = 0, iy = 0, iz = 0;

            switch (face)
            {
                case CUBEFACE_POS_X:
                    faceDir = V3f (1, 0, 0);
                    ix      = 0;
                    iy      = 1;
                    iz      = 2;
                    break;

                case CUBEFACE_NEG_X:
                    faceDir = V3f (-1, 0, 0);
                    ix      = 0;
                    iy      = 1;
                    iz      = 2;
                    break;

                case CUBEFACE_POS_Y:
                    faceDir = V3f (0, 1, 0);
                    ix      = 1;
                    iy      = 0;
                    iz      = 2;
                    break;

                case CUBEFACE_NEG_Y:
                    faceDir = V3f (0, -1, 0);
                    ix      = 1;
                    iy      = 0;
                    iz      = 2;
                    break;

                case CUBEFACE_POS_Z:
                    faceDir = V3f (0, 0, 1);
                    ix      = 2;
                    iy      = 0;
                    iz      = 1;
                    break;

                case CUBEFACE_NEG_Z:
                    faceDir = V3f (0, 0, -1);
                    ix      = 2;
                    iy      = 0;
                    iz      = 1;
                    break;
            }

            for (int y = 0; y < sof; ++y)
            {
                bool yEdge = (y == 0 || y == sof - 1);

                for (int x = 0; x < sof; ++x)
                {
                    bool xEdge = (x == 0 || x == sof - 1);

                    V2f posInFace (x, y);

                    V3f dir =
                        CubeMap::direction (face, dw, posInFace).normalized ();

                    V2f pos = CubeMap::pixelPosition (face, dw, posInFace);

                    //
                    // The solid angle subtended by pixel (x,y), as seen
                    // from the center of the cube, is proportional to the
                    // square of the distance of the pixel from the center
                    // of the cube and proportional to the dot product of
                    // the viewing direction and the normal of the cube
                    // face that contains the pixel.
                    //

                    double weight =
                        (dir ^ faceDir) *
                        (sqr (dir[iy] / dir[ix]) + sqr (dir[iz] / dir[ix]) + 1);

                    //
                    // Pixels at the edges and corners of the
                    // cube are duplicated; we must adjust the
                    // pixel weights accordingly.
                    //

                    if (xEdge && yEdge)
                        weight /= 3;
                    else if (xEdge || yEdge)
                        weight /= 2;

                    Rgba& pixel = pixels[toInt (pos.y)][toInt (pos.x)];

                    pixel.r *= weight;
                    pixel.g *= weight;
                    pixel.b *= weight;
                    pixel.a *= weight;

                    weightTotal += weight;
                }
            }
        }

        //
        // The weighting operation above has made the overall image darker.
        // Apply a correction to recover the image's original brightness.
        //

        int    w         = dw.max.x - dw.min.x + 1;
        int    h         = dw.max.y - dw.min.y + 1;
        size_t numPixels = w * h;
        double weight    = numPixels / weightTotal;

        Rgba* p   = &pixels[0][0];
        Rgba* end = p + numPixels;

        while (p < end)
        {
            p->r *= weight;
            p->g *= weight;
            p->b *= weight;
            p->a *= weight;

            ++p;
        }
    }

    {
        if (verbose) cout << "    generating blurred image" << endl;

        Box2i dw1  = iptr1->dataWindow ();
        int   sof1 = CubeMap::sizeOfFace (dw1);

        Box2i dw2 (V2i (0, 0), V2i (OUT_WIDTH - 1, OUT_WIDTH * 6 - 1));
        int   sof2 = CubeMap::sizeOfFace (dw2);

        iptr2->resize (ENVMAP_CUBE, dw2);
        iptr2->clear ();

        Array2D<Rgba>& pixels1 = iptr1->pixels ();
        Array2D<Rgba>& pixels2 = iptr2->pixels ();

        for (int f2 = CUBEFACE_POS_X; f2 <= CUBEFACE_NEG_Z; ++f2)
        {
            if (verbose) cout << "        face " << f2 << endl;

            CubeMapFace face2 = CubeMapFace (f2);

            for (int y2 = 0; y2 < sof2; ++y2)
            {
                for (int x2 = 0; x2 < sof2; ++x2)
                {
                    V2f posInFace2 (x2, y2);

                    V3f dir2 = CubeMap::direction (face2, dw2, posInFace2);

                    V2f pos2 = CubeMap::pixelPosition (face2, dw2, posInFace2);

                    double weightTotal = 0;
                    double rTotal      = 0;
                    double gTotal      = 0;
                    double bTotal      = 0;
                    double aTotal      = 0;

                    Rgba& pixel2 = pixels2[toInt (pos2.y)][toInt (pos2.x)];

                    for (int f1 = CUBEFACE_POS_X; f1 <= CUBEFACE_NEG_Z; ++f1)
                    {
                        CubeMapFace face1 = CubeMapFace (f1);

                        for (int y1 = 0; y1 < sof1; ++y1)
                        {
                            for (int x1 = 0; x1 < sof1; ++x1)
                            {
                                V2f posInFace1 (x1, y1);

                                V3f dir1 =
                                    CubeMap::direction (face1, dw1, posInFace1);

                                V2f pos1 = CubeMap::pixelPosition (
                                    face1, dw1, posInFace1);

                                double weight = dir1 ^ dir2;

                                if (weight <= 0) continue;

                                Rgba& pixel1 =
                                    pixels1[toInt (pos1.y)][toInt (pos1.x)];

                                weightTotal += weight;
                                rTotal += pixel1.r * weight;
                                gTotal += pixel1.g * weight;
                                bTotal += pixel1.b * weight;
                                aTotal += pixel1.a * weight;
                            }
                        }
                    }

                    pixel2.r = rTotal / weightTotal;
                    pixel2.g = gTotal / weightTotal;
                    pixel2.b = bTotal / weightTotal;
                    pixel2.a = aTotal / weightTotal;
                }
            }
        }

        swap (iptr1, iptr2);
    }

    //
    // Depending on how many times we've re-sampled the image,
    // the result is now either in image1 or in image2.
    // If necessary, copy the result into image1.
    //

    if (iptr1 != &image1)
    {
        if (verbose) cout << "    copying" << endl;

        Box2i dw = iptr1->dataWindow ();
        image1.resize (ENVMAP_CUBE, dw);

        int    w    = dw.max.x - dw.min.x + 1;
        int    h    = dw.max.y - dw.min.y + 1;
        size_t size = w * h * sizeof (Rgba);

        memcpy (&image1.pixels ()[0][0], &iptr1->pixels ()[0][0], size);
    }
}